

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager_receiver.c
# Opt level: O2

apx_error_t apx_fileManagerReceiver_reserve(apx_fileManagerReceiver_t *self,apx_size_t size)

{
  uint8_t *puVar1;
  apx_error_t aVar2;
  
  if (size == 0 || self == (apx_fileManagerReceiver_t *)0x0) {
    aVar2 = 1;
  }
  else if (size < 0x1000001) {
    aVar2 = 0;
    if (self->buf_size < size) {
      free(self->buf_data);
      puVar1 = (uint8_t *)malloc((ulong)size);
      self->buf_data = puVar1;
      if (puVar1 == (uint8_t *)0x0) {
        aVar2 = 2;
      }
      else {
        self->buf_size = size;
      }
    }
  }
  else {
    aVar2 = 0x20;
  }
  return aVar2;
}

Assistant:

apx_error_t apx_fileManagerReceiver_reserve(apx_fileManagerReceiver_t* self, apx_size_t size)
{
   if ( (self != NULL) && (size > 0u) )
   {
      if (size > APX_MAX_FILE_SIZE)
      {
         return APX_FILE_TOO_LARGE_ERROR;
      }
      if (size > self->buf_size)
      {
         uint8_t *old_data = self->buf_data;
         if (old_data != NULL)
         {
            free(old_data);
         }
         self->buf_data = (uint8_t*) malloc(size);
         if (self->buf_data == NULL)
         {
            return APX_MEM_ERROR;
         }
         self->buf_size = size;
      }
      //apx_fileManagerReceiver_reset(self);
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}